

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketHandshake.h
# Opt level: O3

void __thiscall
uWS::WebSocketHandshake::static_for<4,_uWS::WebSocketHandshake::Sha1Loop<2>_>::operator()
          (static_for<4,_uWS::WebSocketHandshake::Sha1Loop<2>_> *this,uint32_t *a,uint32_t *b)

{
  uint uVar1;
  uint uVar2;
  static_for<3,_uWS::WebSocketHandshake::Sha1Loop<2>_> local_11;
  
  static_for<3,_uWS::WebSocketHandshake::Sha1Loop<2>_>::operator()(&local_11,a,b);
  uVar1 = b[0xb] ^ *b ^ b[5] ^ b[3];
  uVar2 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  b[3] = uVar2;
  uVar1 = a[2];
  a[4] = ((a[1] ^ *a) & uVar1 ^ *a) + (a[3] << 5 | a[3] >> 0x1b) + uVar2 + a[4] + 0x5a827999;
  a[2] = uVar1 << 0x1e | uVar1 >> 2;
  return;
}

Assistant:

void operator()(uint32_t *a, uint32_t *b) {
            static_for<N - 1, T>()(a, b);
            T::template f<N - 1>(a, b);
        }